

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  Color pixel_color;
  array<unsigned_char,_3UL> aVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  int i;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  int local_494;
  double local_490;
  undefined1 local_468 [104];
  vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_> img_data;
  string scene_name;
  Color local_3a8;
  string local_388;
  ofstream outfile;
  ProgressBar pb;
  Scene scene;
  
  std::__cxx11::string::string((string *)&scene_name,"three_spheres",(allocator *)&outfile);
  local_494 = 0x28;
  uVar14 = 200;
  iVar5 = 0x28;
  if (1 < argc) {
    std::__cxx11::string::assign((char *)&scene_name);
    if (argc != 2) {
      std::__cxx11::string::string((string *)&outfile,argv[2],(allocator *)&scene);
      uVar4 = std::__cxx11::stoi((string *)&outfile,(size_t *)0x0,10);
      uVar14 = (ulong)uVar4;
      std::__cxx11::string::~string((string *)&outfile);
      iVar5 = local_494;
      if (3 < (uint)argc) {
        std::__cxx11::string::string((string *)&outfile,argv[3],(allocator *)&scene);
        iVar5 = std::__cxx11::stoi((string *)&outfile,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&outfile);
      }
    }
  }
  local_494 = iVar5;
  iVar13 = (int)uVar14;
  std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>::
  vector(&img_data,(ulong)(uint)(iVar13 * iVar13),(allocator_type *)&outfile);
  std::__cxx11::string::string((string *)&local_388,(string *)&scene_name);
  create_scene(&scene,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  ProgressBar::ProgressBar(&pb);
  uVar4 = (uint)((double)iVar13 / 1.7777777777777777);
  uVar8 = (ulong)uVar4;
  iVar6 = uVar4 - 1;
  iVar5 = 0;
  if (0 < local_494) {
    iVar5 = local_494;
  }
  uVar9 = 0;
  if (0 < iVar13) {
    uVar9 = uVar14;
  }
  for (lVar12 = (long)iVar6; -1 < lVar12; lVar12 = lVar12 + -1) {
    lVar10 = iVar6 - lVar12;
    ProgressBar::set_value(&pb,((double)(int)lVar10 * 100.0) / (double)(int)uVar4);
    lVar10 = lVar10 * iVar13;
    for (uVar14 = 0; uVar14 != uVar9; uVar14 = uVar14 + 1) {
      local_468._0_16_ = ZEXT816(0);
      local_490 = 0.0;
      iVar11 = iVar5;
      while (bVar16 = iVar11 != 0, iVar11 = iVar11 + -1, bVar16) {
        dVar1 = nrand();
        dVar2 = nrand();
        Camera::get_ray((Ray *)&outfile,&scene.camera_,
                        (dVar1 + (double)(int)uVar14) / (double)(iVar13 + -1),
                        (dVar2 + (double)(int)lVar12) / (double)iVar6);
        trace_color(&local_3a8,(Ray *)&outfile,&scene.objects_);
        dVar1 = (double)local_468._8_8_ + local_3a8.e[1];
        local_468._8_4_ = SUB84(dVar1,0);
        local_468._0_8_ = (double)local_468._0_8_ + local_3a8.e[0];
        local_468._12_4_ = (int)((ulong)dVar1 >> 0x20);
        local_490 = local_490 + local_3a8.e[2];
      }
      pixel_color.e[2] = local_490;
      pixel_color.e[0] = (double)local_468._0_8_;
      pixel_color.e[1] = (double)local_468._8_8_;
      aVar3 = gen_color(pixel_color,local_494);
      img_data.
      super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar14 + lVar10]._M_elems[2] = aVar3._M_elems[2];
      *(short *)img_data.
                super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14 + lVar10]._M_elems =
           aVar3._M_elems._0_2_;
    }
  }
  std::ofstream::ofstream(&outfile);
  std::ofstream::open((char *)&outfile,0x10f510);
  poVar7 = std::operator<<((ostream *)&outfile,"P6\n");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar13);
  poVar7 = std::operator<<(poVar7," ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar4);
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xff);
  std::operator<<(poVar7,"\n");
  std::ofstream::close();
  std::ofstream::open((char *)&outfile,0x10f510);
  lVar12 = 0;
  if ((int)uVar4 < 1) {
    uVar8 = 0;
  }
  for (uVar14 = 0; lVar10 = lVar12, uVar15 = uVar9, uVar14 != uVar8; uVar14 = uVar14 + 1) {
    while (bVar16 = uVar15 != 0, uVar15 = uVar15 - 1, bVar16) {
      aVar3._M_elems[2] =
           (img_data.
            super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar10 + 2];
      aVar3._M_elems._0_2_ =
           *(undefined2 *)
            ((img_data.
              super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar10);
      write_color(&outfile,aVar3);
      lVar10 = lVar10 + 3;
    }
    lVar12 = lVar12 + (long)iVar13 * 3;
  }
  std::operator<<((ostream *)&outfile,'\n');
  std::ofstream::close();
  std::ofstream::~ofstream(&outfile);
  std::__cxx11::string::~string((string *)&pb);
  ObjectList::~ObjectList(&scene.objects_);
  std::
  _Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>::
  ~_Vector_base(&img_data.
                 super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
               );
  std::__cxx11::string::~string((string *)&scene_name);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

  // options
  std::string scene_name = "three_spheres";

  if (argc > 1) {
    scene_name = argv[1];
  }

  int image_width = 200;


  if (argc > 2) {
    image_width = std::stoi(argv[2]);
  }

  int samples_per_pixel = 40;

  if (argc > 3) {
    samples_per_pixel = std::stoi(argv[3]);
  }

  const int image_height = static_cast<int>(image_width / ASPECT_RATIO);

  std::vector<std::array<uint8_t, 3>> img_data(image_width*image_width);

  // image generation
  Scene scene = create_scene(scene_name);
  ProgressBar pb{};

  for (int j = image_height - 1; j >= 0; --j) {
    pb.set_value(100.0 * (image_height - 1 - j) / (double)image_height);
    #pragma omp parallel for shared(img_data, scene) schedule(dynamic)
    for (int i = 0; i < image_width; ++i) {
      Color pixel_color{0.0, 0.0, 0.0};
      for (int s = 0; s < samples_per_pixel; ++s) {
        double u = (i + nrand()) / (image_width - 1);
        double v = (j + nrand()) / (image_height - 1);
        Ray r = scene.camera().get_ray(u, v);
        pixel_color += trace_color(r, scene.objects());
      }
      img_data[(image_height - 1 - j) * image_width + i] = gen_color(pixel_color, samples_per_pixel);
    }
  }

  // write image file
  std::ofstream outfile;
  outfile.open("image.ppm");

  // write ppm header
  outfile << "P6\n" << image_width << " " << image_height << "\n" << IRGB_MAX << "\n";
  outfile.close();

  outfile.open("image.ppm", std::ios::binary | std::ios::app);

  for (int j = 0; j <= image_height - 1; ++j) {
    for (int i = 0; i < image_width; ++i) {
      write_color(outfile, img_data[j * image_width + i]);
    }
  }
  outfile << '\n';
  outfile.close();


  // used to clean up openmc memory if needed
  teardown();

  return 0;
}